

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O0

Belief * __thiscall
despot::NoisyLaserTag::InitialBelief(NoisyLaserTag *this,State *start,string *type)

{
  int iVar1;
  const_reference pvVar2;
  ParticleBelief *pPVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_90;
  ParticleBelief *local_78;
  ParticleBelief *belief;
  ParticleBelief *local_68;
  TagState *state;
  int opp;
  int rob;
  double wgt;
  int local_3c;
  undefined1 local_38 [4];
  int N;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  string *type_local;
  State *start_local;
  NoisyLaserTag *this_local;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type;
  if (start != (State *)0x0) {
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
    local_3c = despot::Floor::NumCells();
    _opp = (1.0 / (double)local_3c) / (double)local_3c;
    for (state._4_4_ = 0; state._4_4_ < local_3c; state._4_4_ = state._4_4_ + 1) {
      for (state._0_4_ = 0; (int)state < local_3c; state._0_4_ = (int)state + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(this->super_BaseTag).rob_,(long)*(int *)(start + 0xc));
        iVar1 = BaseTag::RobOppIndicesToStateIndex(&this->super_BaseTag,*pvVar2,(int)state);
        belief = (ParticleBelief *)
                 (**(code **)(*(long *)&this->super_BaseTag + 0xe0))(_opp,this,iVar1);
        local_68 = belief;
        std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                  ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38,
                   (value_type *)&belief);
      }
    }
    pPVar3 = (ParticleBelief *)operator_new(0x90);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              (&local_90,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
    despot::ParticleBelief::ParticleBelief
              (pPVar3,&local_90,&(this->super_BaseTag).super_BeliefMDP,0,1);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_90);
    local_78 = pPVar3;
    despot::ParticleBelief::state_indexer((StateIndexer *)pPVar3);
    pPVar3 = local_78;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
    return (Belief *)pPVar3;
  }
  __assert_fail("start != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/examples/cpp_models/tag/src/noisy_laser_tag/noisy_laser_tag.cpp"
                ,0x97,
                "virtual Belief *despot::NoisyLaserTag::InitialBelief(const State *, string) const")
  ;
}

Assistant:

Belief* NoisyLaserTag::InitialBelief(const State* start, string type) const {
	assert(start != NULL);

	vector<State*> particles;
	int N = floor_.NumCells();
	double wgt = 1.0 / N / N;
	for (int rob = 0; rob < N; rob++) {
		for (int opp = 0; opp < N; opp++) {
			TagState* state = static_cast<TagState*>(Allocate(
				RobOppIndicesToStateIndex(rob_[start->state_id], opp), wgt));
			particles.push_back(state);
		}
	}

	ParticleBelief* belief = new ParticleBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}